

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_sse2.c
# Opt level: O1

uint64_t av1_wedge_sse_from_residuals_sse2(int16_t *r1,int16_t *d,uint8_t *m,int N)

{
  int16_t *piVar1;
  int16_t *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  undefined1 auVar26 [16];
  unkint10 Var27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  lVar18 = (long)N;
  lVar17 = (long)-N;
  lVar19 = 0;
  lVar20 = 0;
  lVar25 = 0;
  do {
    piVar1 = r1 + lVar18 + lVar17 + lVar19;
    piVar2 = r1 + lVar18 + (8 - N) + lVar19;
    auVar24 = *(undefined1 (*) [16])(d + lVar18 + lVar17 + lVar19);
    auVar32 = *(undefined1 (*) [16])(d + lVar18 + (8 - N) + lVar19);
    auVar3 = *(undefined1 (*) [16])(m + lVar19 + lVar17 + lVar18);
    auVar44._0_12_ = auVar24._0_12_;
    auVar44._12_2_ = auVar24._6_2_;
    auVar44._14_2_ = piVar1[3];
    auVar43._12_4_ = auVar44._12_4_;
    auVar43._0_10_ = auVar24._0_10_;
    auVar43._10_2_ = piVar1[2];
    auVar42._10_6_ = auVar43._10_6_;
    auVar42._0_8_ = auVar24._0_8_;
    auVar42._8_2_ = auVar24._4_2_;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41._6_2_ = piVar1[1];
    auVar41._4_2_ = auVar24._2_2_;
    auVar41._0_2_ = auVar24._0_2_;
    auVar41._2_2_ = *piVar1;
    auVar40._2_2_ = piVar1[4];
    auVar40._0_2_ = auVar24._8_2_;
    auVar40._4_2_ = auVar24._10_2_;
    auVar40._6_2_ = piVar1[5];
    auVar40._8_2_ = auVar24._12_2_;
    auVar40._10_2_ = piVar1[6];
    auVar40._12_2_ = auVar24._14_2_;
    auVar40._14_2_ = piVar1[7];
    auVar37._0_12_ = auVar32._0_12_;
    auVar37._12_2_ = auVar32._6_2_;
    auVar37._14_2_ = piVar2[3];
    auVar36._12_4_ = auVar37._12_4_;
    auVar36._0_10_ = auVar32._0_10_;
    auVar36._10_2_ = piVar2[2];
    auVar35._10_6_ = auVar36._10_6_;
    auVar35._0_8_ = auVar32._0_8_;
    auVar35._8_2_ = auVar32._4_2_;
    auVar34._8_8_ = auVar35._8_8_;
    auVar34._6_2_ = piVar2[1];
    auVar34._4_2_ = auVar32._2_2_;
    auVar34._0_2_ = auVar32._0_2_;
    auVar34._2_2_ = *piVar2;
    auVar26._2_2_ = piVar2[4];
    auVar26._0_2_ = auVar32._8_2_;
    auVar26._4_2_ = auVar32._10_2_;
    auVar26._6_2_ = piVar2[5];
    auVar26._8_2_ = auVar32._12_2_;
    auVar26._10_2_ = piVar2[6];
    auVar26._12_2_ = auVar32._14_2_;
    auVar26._14_2_ = piVar2[7];
    auVar4[0xd] = 0;
    auVar4._0_13_ = auVar3._0_13_;
    auVar4[0xe] = auVar3[7];
    auVar5[0xc] = auVar3[6];
    auVar5._0_12_ = auVar3._0_12_;
    auVar5._13_2_ = auVar4._13_2_;
    auVar6[0xb] = 0;
    auVar6._0_11_ = auVar3._0_11_;
    auVar6._12_3_ = auVar5._12_3_;
    auVar7[10] = auVar3[5];
    auVar7._0_10_ = auVar3._0_10_;
    auVar7._11_4_ = auVar6._11_4_;
    auVar8[9] = 0;
    auVar8._0_9_ = auVar3._0_9_;
    auVar8._10_5_ = auVar7._10_5_;
    auVar9[8] = auVar3[4];
    auVar9._0_8_ = auVar3._0_8_;
    auVar9._9_6_ = auVar8._9_6_;
    auVar11._7_8_ = 0;
    auVar11._0_7_ = auVar9._8_7_;
    Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),auVar3[3]);
    auVar15._9_6_ = 0;
    auVar15._0_9_ = Var12;
    auVar13._1_10_ = SUB1510(auVar15 << 0x30,5);
    auVar13[0] = auVar3[2];
    auVar16._11_4_ = 0;
    auVar16._0_11_ = auVar13;
    auVar10[2] = auVar3[1];
    auVar10._0_2_ = auVar3._0_2_;
    auVar10._3_12_ = SUB1512(auVar16 << 0x20,3);
    auVar14._13_2_ = 0;
    auVar14._0_13_ = auVar10._2_13_;
    auVar24[1] = 0;
    auVar24[0] = auVar3[8];
    Var27 = (unkuint10)auVar3[0xc] << 0x40;
    auVar23[10] = auVar3[0xd];
    auVar23._0_10_ = Var27;
    auVar23[0xb] = 0;
    auVar33._0_12_ = SUB1512(auVar14 << 0x10,0);
    auVar33._12_2_ = (short)Var12;
    auVar33._14_2_ = L'@';
    auVar31._12_4_ = auVar33._12_4_;
    auVar31._0_10_ = SUB1510(auVar14 << 0x10,0);
    auVar31._10_2_ = L'@';
    auVar30._10_6_ = auVar31._10_6_;
    auVar30._8_2_ = auVar13._0_2_;
    auVar30._0_8_ = 0x40000000000000;
    auVar29._6_10_ = auVar30._6_10_;
    auVar29._4_2_ = auVar10._2_2_;
    auVar29._0_4_ = CONCAT22(L'@',auVar3._0_2_) & 0xffff00ff;
    auVar32 = pmaddwd(auVar29,auVar41);
    auVar38._2_2_ = 0;
    auVar38._0_2_ = auVar9._8_2_;
    auVar38._4_2_ = auVar7._10_2_;
    auVar38._6_2_ = 0;
    auVar38._8_2_ = auVar5._12_2_;
    auVar38._10_2_ = 0;
    auVar38[0xc] = auVar3[7];
    auVar38[0xd] = 0;
    auVar38._14_2_ = 0x40;
    auVar39 = pmaddwd(auVar38,auVar40);
    auVar32 = packssdw(auVar32,auVar39);
    auVar33 = pmaddwd(auVar32,auVar32);
    auVar23[0xc] = auVar3[0xb];
    auVar23[0xd] = 0;
    auVar23._14_2_ = L'@';
    auVar22._12_4_ = auVar23._12_4_;
    auVar22._10_2_ = L'@';
    auVar22._0_10_ = Var27;
    auVar21._10_6_ = auVar22._10_6_;
    auVar21._0_10_ = (unkuint10)auVar3[10] << 0x40;
    auVar39._8_8_ = auVar21._8_8_;
    auVar39._0_8_ = 0x40000000000000;
    auVar32._6_10_ = auVar39._6_10_;
    auVar32._0_6_ = (uint6)auVar3[9] << 0x20;
    auVar24._4_12_ = auVar32._4_12_;
    auVar24._2_2_ = L'@';
    auVar24 = pmaddwd(auVar24,auVar34);
    auVar28._1_3_ = 0;
    auVar28[0] = auVar3[0xc];
    auVar28[4] = auVar3[0xd];
    auVar28._5_3_ = 0;
    auVar28[8] = auVar3[0xe];
    auVar28._9_3_ = 0;
    auVar28[0xc] = auVar3[0xf];
    auVar28[0xd] = 0;
    auVar28._14_2_ = 0x40;
    auVar32 = pmaddwd(auVar28,auVar26);
    auVar24 = packssdw(auVar24,auVar32);
    auVar24 = pmaddwd(auVar24,auVar24);
    lVar20 = (auVar24._0_8_ >> 0x20) + SUB168(auVar33 & _DAT_00517780,0) +
             (auVar33._0_8_ >> 0x20) + lVar20 + SUB168(auVar24 & _DAT_00517780,0);
    lVar25 = (auVar24._8_8_ >> 0x20) + SUB168(auVar33 & _DAT_00517780,8) +
             (auVar33._8_8_ >> 0x20) + lVar25 + SUB168(auVar24 & _DAT_00517780,8);
    lVar19 = lVar19 + 0x10;
  } while (-lVar19 != lVar17);
  return lVar25 + lVar20 + 0x800U >> 0xc;
}

Assistant:

uint64_t av1_wedge_sse_from_residuals_sse2(const int16_t *r1, const int16_t *d,
                                           const uint8_t *m, int N) {
  int n = -N;
  int n8 = n + 8;

  uint64_t csse;

  const __m128i v_mask_max_w = _mm_set1_epi16(MAX_MASK_VALUE);
  const __m128i v_zext_q = _mm_set1_epi64x(~0u);

  __m128i v_acc0_q = _mm_setzero_si128();

  assert(N % 64 == 0);

  r1 += N;
  d += N;
  m += N;

  do {
    const __m128i v_r0_w = xx_load_128(r1 + n);
    const __m128i v_r1_w = xx_load_128(r1 + n8);
    const __m128i v_d0_w = xx_load_128(d + n);
    const __m128i v_d1_w = xx_load_128(d + n8);
    const __m128i v_m01_b = xx_load_128(m + n);

    const __m128i v_rd0l_w = _mm_unpacklo_epi16(v_d0_w, v_r0_w);
    const __m128i v_rd0h_w = _mm_unpackhi_epi16(v_d0_w, v_r0_w);
    const __m128i v_rd1l_w = _mm_unpacklo_epi16(v_d1_w, v_r1_w);
    const __m128i v_rd1h_w = _mm_unpackhi_epi16(v_d1_w, v_r1_w);
    const __m128i v_m0_w = _mm_unpacklo_epi8(v_m01_b, _mm_setzero_si128());
    const __m128i v_m1_w = _mm_unpackhi_epi8(v_m01_b, _mm_setzero_si128());

    const __m128i v_m0l_w = _mm_unpacklo_epi16(v_m0_w, v_mask_max_w);
    const __m128i v_m0h_w = _mm_unpackhi_epi16(v_m0_w, v_mask_max_w);
    const __m128i v_m1l_w = _mm_unpacklo_epi16(v_m1_w, v_mask_max_w);
    const __m128i v_m1h_w = _mm_unpackhi_epi16(v_m1_w, v_mask_max_w);

    const __m128i v_t0l_d = _mm_madd_epi16(v_rd0l_w, v_m0l_w);
    const __m128i v_t0h_d = _mm_madd_epi16(v_rd0h_w, v_m0h_w);
    const __m128i v_t1l_d = _mm_madd_epi16(v_rd1l_w, v_m1l_w);
    const __m128i v_t1h_d = _mm_madd_epi16(v_rd1h_w, v_m1h_w);

    const __m128i v_t0_w = _mm_packs_epi32(v_t0l_d, v_t0h_d);
    const __m128i v_t1_w = _mm_packs_epi32(v_t1l_d, v_t1h_d);

    const __m128i v_sq0_d = _mm_madd_epi16(v_t0_w, v_t0_w);
    const __m128i v_sq1_d = _mm_madd_epi16(v_t1_w, v_t1_w);

    const __m128i v_sum0_q = _mm_add_epi64(_mm_and_si128(v_sq0_d, v_zext_q),
                                           _mm_srli_epi64(v_sq0_d, 32));
    const __m128i v_sum1_q = _mm_add_epi64(_mm_and_si128(v_sq1_d, v_zext_q),
                                           _mm_srli_epi64(v_sq1_d, 32));

    v_acc0_q = _mm_add_epi64(v_acc0_q, v_sum0_q);
    v_acc0_q = _mm_add_epi64(v_acc0_q, v_sum1_q);

    n8 += 16;
    n += 16;
  } while (n);

  v_acc0_q = _mm_add_epi64(v_acc0_q, _mm_srli_si128(v_acc0_q, 8));

#if AOM_ARCH_X86_64
  csse = (uint64_t)_mm_cvtsi128_si64(v_acc0_q);
#else
  xx_storel_64(&csse, v_acc0_q);
#endif

  return ROUND_POWER_OF_TWO(csse, 2 * WEDGE_WEIGHT_BITS);
}